

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.hpp
# Opt level: O3

void __thiscall remote::Region::~Region(Region *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->pathname)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->pathname).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Region() {
            start = end = 0;
            read = write = exec = shared = false;
            offset = deviceMajor = deviceMinor = inodeFileNumber = 0;
            pathname.clear();
            filename.clear();
        }